

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.c
# Opt level: O1

SqQueue EnQueue2(SqQueue Q,ElementType e)

{
  int iVar1;
  ulong uVar2;
  SqQueue SVar3;
  
  iVar1 = Q.front;
  if (((iVar1 + 1) / 100) * -100 + iVar1 + 1 == iVar1) {
    printf(anon_var_dwarf_9e);
  }
  Q.base[(long)Q._8_8_ >> 0x20] = e;
  uVar2 = Q._8_8_ & 0xffffffff | (ulong)(uint)((Q.rear + 1) % 100) << 0x20;
  puts(&DAT_00102074);
  SVar3.front = (int)uVar2;
  SVar3.rear = (int)(uVar2 >> 0x20);
  SVar3.base = Q.base;
  return SVar3;
}

Assistant:

SqQueue EnQueue2(SqQueue Q,ElementType e){
    if((Q.front + 1) % MAXQSIZE == Q.front){
        printf("队列已满");
    }
    Q.base[Q.rear] = e;
    Q.rear = (Q.rear + 1) % MAXQSIZE;
    printf("成功插入元素\n");
    return Q;
}